

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.h
# Opt level: O0

EvaluationFunction *
imrt::EvaluationFunction::getInstance
          (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,Collimator *collimator)

{
  EvaluationFunction *pEVar1;
  Collimator *in_stack_00000140;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_stack_00000148;
  EvaluationFunction *in_stack_00000150;
  
  if (instance == (EvaluationFunction *)0x0) {
    pEVar1 = (EvaluationFunction *)operator_new(0x180);
    EvaluationFunction(in_stack_00000150,in_stack_00000148,in_stack_00000140);
    instance = pEVar1;
  }
  return instance;
}

Assistant:

static EvaluationFunction& getInstance(vector<Volume>& volumes, const Collimator& collimator){
		if(!instance) instance = new EvaluationFunction(volumes, collimator);
		return *instance;
	}